

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbmphandler.cpp
# Opt level: O3

bool __thiscall QBmpHandler::canRead(QBmpHandler *this)

{
  bool bVar1;
  bool bVar2;
  InternalFormat IVar3;
  QIODevice *device;
  char *pcVar4;
  long in_FS_OFFSET;
  QByteArray local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  IVar3 = this->m_format;
  if (IVar3 == BmpFormat && this->state == Ready) {
    device = QImageIOHandler::device(&this->super_QImageIOHandler);
    bVar1 = canRead(device);
    bVar2 = false;
    if ((!bVar1) || (bVar2 = false, this->state == Error)) goto LAB_0026b87e;
    IVar3 = this->m_format;
  }
  else if (this->state == Error) {
    bVar2 = false;
    goto LAB_0026b87e;
  }
  pcVar4 = "dib";
  if (IVar3 == BmpFormat) {
    pcVar4 = "bmp";
  }
  QByteArray::QByteArray(&local_30,pcVar4,-1);
  QImageIOHandler::setFormat(&this->super_QImageIOHandler,&local_30);
  if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,1,0x10);
    }
  }
  bVar2 = true;
LAB_0026b87e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QBmpHandler::canRead() const
{
    if (m_format == BmpFormat && state == Ready && !canRead(device()))
        return false;

    if (state != Error) {
        setFormat(formatName());
        return true;
    }

    return false;
}